

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O1

int run_test_timer_no_double_call_nowait(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  uv_handle_t *handle;
  long *plVar3;
  char *handle_00;
  int64_t eval_b;
  int64_t eval_a;
  uv_timer_t timer_handle;
  long lStack_140;
  uv_loop_t *puStack_138;
  void *pvStack_128;
  undefined1 auStack_120 [8];
  uv_timer_t uStack_118;
  uv_loop_t *puStack_a0;
  long local_90;
  long local_88;
  uv_timer_t local_80;
  
  puStack_a0 = (uv_loop_t *)0x1d4067;
  puVar2 = uv_default_loop();
  puStack_a0 = (uv_loop_t *)0x1d4074;
  iVar1 = uv_timer_init(puVar2,&local_80);
  local_88 = (long)iVar1;
  local_90 = 0;
  if (local_88 == 0) {
    puStack_a0 = (uv_loop_t *)0x1d40af;
    iVar1 = uv_timer_start(&local_80,timer_check_double_call,10,10);
    local_88 = (long)iVar1;
    local_90 = 0;
    if (local_88 != 0) goto LAB_001d419b;
    puStack_a0 = (uv_loop_t *)0x1d40d9;
    uv_sleep(0x14);
    local_88 = 1;
    puStack_a0 = (uv_loop_t *)0x1d40e7;
    puVar2 = uv_default_loop();
    puStack_a0 = (uv_loop_t *)0x1d40f4;
    iVar1 = uv_run(puVar2,UV_RUN_NOWAIT);
    local_90 = (long)iVar1;
    if (local_88 != local_90) goto LAB_001d41aa;
    local_88 = 1;
    local_90 = (long)timer_check_double_call_called;
    if (local_90 != 1) goto LAB_001d41b9;
    puStack_a0 = (uv_loop_t *)0x1d4135;
    unaff_RBX = uv_default_loop();
    puStack_a0 = (uv_loop_t *)0x1d4149;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_a0 = (uv_loop_t *)0x1d4153;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_88 = 0;
    puStack_a0 = (uv_loop_t *)0x1d4161;
    puVar2 = uv_default_loop();
    puStack_a0 = (uv_loop_t *)0x1d4169;
    iVar1 = uv_loop_close(puVar2);
    local_90 = (long)iVar1;
    if (local_88 == local_90) {
      puStack_a0 = (uv_loop_t *)0x1d4181;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_a0 = (uv_loop_t *)0x1d419b;
    run_test_timer_no_double_call_nowait_cold_1();
LAB_001d419b:
    puStack_a0 = (uv_loop_t *)0x1d41aa;
    run_test_timer_no_double_call_nowait_cold_2();
LAB_001d41aa:
    puStack_a0 = (uv_loop_t *)0x1d41b9;
    run_test_timer_no_double_call_nowait_cold_3();
LAB_001d41b9:
    puStack_a0 = (uv_loop_t *)0x1d41c8;
    run_test_timer_no_double_call_nowait_cold_4();
  }
  puStack_a0 = (uv_loop_t *)run_test_timer_no_run_on_unref;
  run_test_timer_no_double_call_nowait_cold_5();
  puStack_138 = (uv_loop_t *)0x1d41e4;
  puStack_a0 = unaff_RBX;
  puVar2 = uv_default_loop();
  puStack_138 = (uv_loop_t *)0x1d41f1;
  iVar1 = uv_timer_init(puVar2,(uv_timer_t *)(auStack_120 + 8));
  auStack_120 = (undefined1  [8])(long)iVar1;
  pvStack_128 = (void *)0x0;
  if (auStack_120 == (undefined1  [8])0x0) {
    puStack_138 = (uv_loop_t *)0x1d4226;
    iVar1 = uv_timer_start((uv_timer_t *)(auStack_120 + 8),abort,0,0);
    auStack_120 = (undefined1  [8])(long)iVar1;
    pvStack_128 = (void *)0x0;
    if (auStack_120 != (undefined1  [8])0x0) goto LAB_001d42e6;
    puStack_138 = (uv_loop_t *)0x1d4250;
    uv_unref((uv_handle_t *)(auStack_120 + 8));
    puStack_138 = (uv_loop_t *)0x1d4255;
    puVar2 = uv_default_loop();
    puStack_138 = (uv_loop_t *)0x1d425f;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_120 = (undefined1  [8])(long)iVar1;
    pvStack_128 = (void *)0x0;
    if (auStack_120 == (undefined1  [8])0x0) {
      puStack_138 = (uv_loop_t *)0x1d4280;
      unaff_RBX = uv_default_loop();
      puStack_138 = (uv_loop_t *)0x1d4294;
      uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
      puStack_138 = (uv_loop_t *)0x1d429e;
      uv_run(unaff_RBX,UV_RUN_DEFAULT);
      auStack_120 = (undefined1  [8])0x0;
      puStack_138 = (uv_loop_t *)0x1d42ac;
      puVar2 = uv_default_loop();
      puStack_138 = (uv_loop_t *)0x1d42b4;
      iVar1 = uv_loop_close(puVar2);
      pvStack_128 = (void *)(long)iVar1;
      if (auStack_120 == (undefined1  [8])pvStack_128) {
        puStack_138 = (uv_loop_t *)0x1d42cc;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d4304;
    }
  }
  else {
    puStack_138 = (uv_loop_t *)0x1d42e6;
    run_test_timer_no_run_on_unref_cold_1();
LAB_001d42e6:
    puStack_138 = (uv_loop_t *)0x1d42f5;
    run_test_timer_no_run_on_unref_cold_2();
  }
  puStack_138 = (uv_loop_t *)0x1d4304;
  run_test_timer_no_run_on_unref_cold_3();
LAB_001d4304:
  handle = (uv_handle_t *)auStack_120;
  puStack_138 = (uv_loop_t *)once_close_cb;
  run_test_timer_no_run_on_unref_cold_4();
  puStack_138 = unaff_RBX;
  puts("ONCE_CLOSE_CB");
  if (handle == (uv_handle_t *)0x0) {
    once_close_cb_cold_2();
  }
  else {
    iVar1 = uv_is_active(handle);
    lStack_140 = (long)iVar1;
    if (lStack_140 == 0) {
      once_close_cb_called = once_close_cb_called + 1;
      return iVar1;
    }
  }
  plVar3 = &lStack_140;
  once_close_cb_cold_1();
  handle_00 = "REPEAT_CLOSE_CB";
  iVar1 = puts("REPEAT_CLOSE_CB");
  if (plVar3 != (long *)0x0) {
    repeat_close_cb_called = repeat_close_cb_called + 1;
    return iVar1;
  }
  repeat_close_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)handle_00);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)handle_00,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(timer_no_double_call_nowait) {
  uv_timer_t timer_handle;
  const uint64_t timeout_ms = 10;

  ASSERT_OK(uv_timer_init(uv_default_loop(), &timer_handle));
  ASSERT_OK(uv_timer_start(&timer_handle,
                           timer_check_double_call,
                           timeout_ms,
                           timeout_ms));
  uv_sleep(timeout_ms * 2);
  ASSERT_EQ(1, uv_run(uv_default_loop(), UV_RUN_NOWAIT));
  ASSERT_EQ(1, timer_check_double_call_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}